

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsnav.c
# Opt level: O0

void fsnav_free(void)

{
  ulong local_10;
  size_t r;
  
  fsnav_free_null(&(fsnav->core).plugins);
  (fsnav->core).plugin_count = 0;
  fsnav_free_null(&fsnav->cfg);
  fsnav->cfglength = 0;
  fsnav->cfg_settings = (char *)0x0;
  fsnav->settings_length = 0;
  fsnav_free_imu();
  if (fsnav->gnss != (fsnav_gnss *)0x0) {
    for (local_10 = 0; local_10 < fsnav->gnss_count; local_10 = local_10 + 1) {
      fsnav_free_gnss(fsnav->gnss + local_10);
    }
    free(fsnav->gnss);
    fsnav->gnss = (fsnav_gnss *)0x0;
  }
  fsnav->gnss_count = 0;
  fsnav_free_air();
  fsnav_free_ref();
  fsnav_free_sol(&fsnav->sol);
  return;
}

Assistant:

void fsnav_free()
{
	size_t r;

	// core
	fsnav_free_null((void**)(&(fsnav->core.plugins)));
	fsnav->core.plugin_count = 0;

	// configuration string
	fsnav_free_null((void**)(&(fsnav->cfg)));
	fsnav->cfglength = 0;
	fsnav->cfg_settings = NULL;
	fsnav->settings_length = 0;

	// imu
	fsnav_free_imu();

	// gnss
	if (fsnav->gnss != NULL) {
		for (r = 0; r < fsnav->gnss_count; r++)
			fsnav_free_gnss(&(fsnav->gnss[r]));
		free((void*)(fsnav->gnss));
		fsnav->gnss = NULL;
	}
	fsnav->gnss_count = 0;

	// air data
	fsnav_free_air();

	// reference data
	fsnav_free_ref();

	// solution
	fsnav_free_sol(&(fsnav->sol));
}